

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O2

void __thiscall Deck::~Deck(Deck *this)

{
  _Vector_base<CardType,_std::allocator<CardType>_> *p_Var1;
  
  operator_delete(this->deckSize,4);
  p_Var1 = &this->deckPointer->super__Vector_base<CardType,_std::allocator<CardType>_>;
  if (p_Var1 != (_Vector_base<CardType,_std::allocator<CardType>_> *)0x0) {
    std::_Vector_base<CardType,_std::allocator<CardType>_>::~_Vector_base(p_Var1);
  }
  operator_delete(p_Var1,0x18);
  p_Var1 = &this->discardPointer->super__Vector_base<CardType,_std::allocator<CardType>_>;
  if (p_Var1 != (_Vector_base<CardType,_std::allocator<CardType>_> *)0x0) {
    std::_Vector_base<CardType,_std::allocator<CardType>_>::~_Vector_base(p_Var1);
  }
  operator_delete(p_Var1,0x18);
  return;
}

Assistant:

Deck::~Deck() {
    delete deckSize;
    delete deckPointer;
    delete discardPointer;
}